

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

void handle_sqlite_callback
               (void *qobj,int aoperation,char *adbname,char *atablename,sqlite3_int64 arowid)

{
  char *pcVar1;
  storage_type_conflict *psVar2;
  storage_type_conflict *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QArrayData *local_80 [3];
  sqlite3_int64 local_68;
  void *local_60;
  QArrayData **local_58;
  sqlite3_int64 *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  QMetaTypeInterface *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = arowid;
  if (qobj != (void *)0x0) {
    if (atablename == (char *)0x0) {
      psVar3 = (storage_type_conflict *)0x0;
    }
    else {
      psVar2 = (storage_type_conflict *)0xffffffffffffffff;
      do {
        psVar3 = psVar2 + 1;
        pcVar1 = atablename + 1 + (long)psVar2;
        psVar2 = psVar3;
      } while (*pcVar1 != '\0');
    }
    QVar4.m_data = psVar3;
    QVar4.m_size = (qsizetype)local_80;
    QString::fromUtf8(QVar4);
    local_60 = (void *)0x0;
    local_50 = &local_68;
    local_48 = (char *)0x0;
    local_40 = "QString";
    local_38 = "qint64";
    local_30 = (QMetaTypeInterface *)0x0;
    local_28 = &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
    local_20 = &QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType;
    local_58 = local_80;
    QMetaObject::invokeMethodImpl
              ((QObject *)qobj,"handleNotification",QueuedConnection,3,&local_60,&local_48,&local_30
              );
    if (local_80[0] != (QArrayData *)0x0) {
      LOCK();
      (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_80[0],2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void handle_sqlite_callback(void *qobj,int aoperation, char const *adbname, char const *atablename,
                                   sqlite3_int64 arowid)
{
    Q_UNUSED(aoperation);
    Q_UNUSED(adbname);
    QSQLiteDriver *driver = static_cast<QSQLiteDriver *>(qobj);
    if (driver) {
        QMetaObject::invokeMethod(driver, "handleNotification", Qt::QueuedConnection,
                                  Q_ARG(QString, QString::fromUtf8(atablename)), Q_ARG(qint64, arowid));
    }
}